

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O1

void aes_cbc_sw_decrypt(ssh_cipher *ciph,void *vblk,int blklen)

{
  ssh_cipheralg *psVar1;
  ssh_cipheralg *psVar2;
  ssh_cipheralg *psVar3;
  ssh_cipheralg *psVar4;
  ssh_cipheralg *psVar5;
  ssh_cipheralg *psVar6;
  ssh_cipheralg *psVar7;
  ssh_cipheralg *psVar8;
  uint7 uVar9;
  uint7 uVar10;
  undefined8 uVar11;
  void *pvVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ssh_cipher *psVar16;
  byte bVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined8 *vout;
  ulong uVar27;
  ulong uVar28;
  ssh_cipher *psVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  BignumInt x_1;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  BignumInt bit7;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  BignumInt x;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  long lVar49;
  ulong uVar50;
  ulong uVar51;
  uint8_t data [64];
  ulong local_138;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong local_80;
  ulong local_78;
  ssh_cipher *local_70;
  ssh_cipher *local_68;
  ssh_cipher *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  void *local_40;
  ulong local_38;
  
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_70 = ciph;
  if (0x1e < blklen + 0xfU) {
    local_60 = ciph + -0xa2;
    uVar14 = blklen + 0xfU;
    if (-1 < blklen) {
      uVar14 = blklen;
    }
    uVar15 = (ulong)((int)uVar14 >> 4);
    local_68 = ciph + -0xb;
    do {
      local_50 = 4;
      if (uVar15 < 4) {
        local_50 = uVar15;
      }
      local_58 = (ulong)(uint)((int)local_50 << 4);
      local_48 = uVar15;
      local_40 = vblk;
      memcpy(&local_c8,vblk,local_58);
      pvVar12 = local_40;
      uVar15 = local_50;
      uVar32 = ((local_c8 >> 7 ^ local_c8 & 0xffffffffffffff) & 0xaa00aa00aa00aa) * 0x81 ^ local_c8;
      uVar27 = ((uStack_c0 >> 7 ^ uStack_c0 & 0xffffffffffffff) & 0xaa00aa00aa00aa) * 0x81 ^
               uStack_c0;
      uVar32 = ((uVar32 >> 0xe ^ uVar32) & 0xcccc0000cccc) * 0x4001 ^ uVar32;
      uVar27 = ((uVar27 >> 0xe ^ uVar27) & 0xcccc0000cccc) * 0x4001 ^ uVar27;
      uVar21 = (ulong)(((uint)(uVar32 >> 0x1c) ^ (uint)uVar32) & 0xf0f0f0f0);
      uVar32 = (uVar21 << 0x1c | uVar21) ^ uVar32;
      uVar21 = (ulong)(((uint)(uVar27 >> 0x1c) ^ (uint)uVar27) & 0xf0f0f0f0);
      uVar27 = (uVar21 << 0x1c | uVar21) ^ uVar27;
      uVar28 = (uVar32 >> 8 ^ uVar27) & 0xff00ff00ff00ff;
      uVar32 = uVar28 << 8 ^ uVar32;
      uVar28 = uVar28 ^ uVar27;
      uVar21 = uVar32 & 0xffff;
      uVar30 = uVar32 >> 0x10 & 0xffff;
      uVar27 = uVar32 >> 0x20 & 0xffff;
      uVar32 = uVar32 >> 0x30;
      uVar33 = uVar28 & 0xffff;
      uVar37 = uVar28 >> 0x10 & 0xffff;
      uVar34 = uVar28 >> 0x20 & 0xffff;
      uVar28 = uVar28 >> 0x30;
      lVar18 = 0;
      do {
        uVar9 = CONCAT16(*(undefined1 *)((long)&local_b8 + lVar18 + 6),
                         CONCAT15(*(undefined1 *)((long)&local_b8 + lVar18 + 5),
                                  CONCAT14(*(undefined1 *)((long)&local_b8 + lVar18 + 4),
                                           *(undefined4 *)((long)&local_b8 + lVar18))));
        uVar45 = CONCAT17(*(undefined1 *)((long)&local_b8 + lVar18 + 7),uVar9);
        uVar10 = CONCAT16(*(undefined1 *)((long)&uStack_b0 + lVar18 + 6),
                          CONCAT15(*(undefined1 *)((long)&uStack_b0 + lVar18 + 5),
                                   CONCAT14(*(undefined1 *)((long)&uStack_b0 + lVar18 + 4),
                                            *(undefined4 *)((long)&uStack_b0 + lVar18))));
        uVar23 = CONCAT17(*(undefined1 *)((long)&uStack_b0 + lVar18 + 7),uVar10);
        uVar45 = ((uVar45 >> 7 ^ (ulong)uVar9) & 0xaa00aa00aa00aa) * 0x81 ^ uVar45;
        uVar23 = ((uVar23 >> 7 ^ (ulong)uVar10) & 0xaa00aa00aa00aa) * 0x81 ^ uVar23;
        uVar45 = ((uVar45 >> 0xe ^ uVar45) & 0xcccc0000cccc) * 0x4001 ^ uVar45;
        uVar23 = ((uVar23 >> 0xe ^ uVar23) & 0xcccc0000cccc) * 0x4001 ^ uVar23;
        uVar24 = (ulong)(((uint)(uVar45 >> 0x1c) ^ (uint)uVar45) & 0xf0f0f0f0);
        uVar45 = (uVar24 << 0x1c | uVar24) ^ uVar45;
        uVar24 = (ulong)(((uint)(uVar23 >> 0x1c) ^ (uint)uVar23) & 0xf0f0f0f0);
        uVar23 = (uVar24 << 0x1c | uVar24) ^ uVar23;
        uVar24 = (uVar45 >> 8 ^ uVar23) & 0xff00ff00ff00ff;
        uVar45 = uVar24 << 8 ^ uVar45;
        lVar18 = lVar18 + 0x10;
        bVar17 = (byte)lVar18;
        uVar24 = uVar24 ^ uVar23;
        uVar21 = uVar21 | (uVar45 & 0xffff) << (bVar17 & 0x3f);
        uVar30 = uVar30 | (uVar45 >> 0x10 & 0xffff) << (bVar17 & 0x3f);
        uVar27 = uVar27 | (uVar45 >> 0x20 & 0xffff) << (bVar17 & 0x3f);
        uVar32 = uVar32 | (uVar45 >> 0x30) << (bVar17 & 0x3f);
        uVar33 = uVar33 | (uVar24 & 0xffff) << (bVar17 & 0x3f);
        uVar37 = uVar37 | (uVar24 >> 0x10 & 0xffff) << (bVar17 & 0x3f);
        uVar34 = uVar34 | (uVar24 >> 0x20 & 0xffff) << (bVar17 & 0x3f);
        uVar28 = uVar28 | (uVar24 >> 0x30) << (bVar17 & 0x3f);
      } while (lVar18 != 0x30);
      uVar14 = *(uint *)&local_70[-0xc].vt;
      uVar45 = (ulong)(uVar14 * 8);
      uVar21 = uVar21 ^ (ulong)local_70[uVar45 - 0xa2].vt;
      uVar33 = uVar33 ^ (ulong)local_70[uVar45 - 0xa1].vt;
      uVar37 = uVar37 ^ (ulong)local_70[uVar45 - 0x9f].vt;
      uVar27 = uVar27 ^ (ulong)local_70[uVar45 - 0x9e].vt;
      uVar34 = uVar34 ^ (ulong)local_70[uVar45 - 0x9d].vt;
      uVar32 = uVar32 ^ (ulong)local_70[uVar45 - 0x9c].vt;
      uVar28 = uVar28 ^ (ulong)local_70[uVar45 - 0x9b].vt;
      uVar40 = uVar32 ^ uVar27;
      uVar23 = uVar27 ^ uVar37;
      uVar22 = uVar21 ^ uVar23;
      uVar24 = uVar40 ^ uVar21 ^ uVar33;
      uVar25 = uVar24 ^ uVar23;
      uVar32 = uVar28 ^ uVar32;
      uVar31 = uVar30 ^ (ulong)local_70[uVar45 - 0xa0].vt ^ uVar25 ^ uVar28;
      uVar42 = uVar25 ^ uVar28 ^ uVar37;
      uVar26 = uVar28 ^ uVar40;
      uVar30 = uVar24 ^ uVar34;
      uVar35 = uVar30 ^ uVar22;
      uVar19 = uVar32 ^ uVar37 ^ uVar21;
      uVar41 = uVar31 ^ uVar23 ^ uVar30;
      uVar36 = uVar41 ^ uVar26;
      uVar38 = (uVar31 ^ uVar23) & uVar23;
      uVar43 = (uVar36 ^ uVar35) & (uVar32 ^ uVar23) ^ uVar38;
      uVar38 = uVar19 & uVar32 ^ uVar38;
      uVar20 = uVar36 & uVar42;
      uVar46 = uVar41 & uVar24 ^ uVar37 ^ uVar21 ^ uVar38 ^ uVar20;
      uVar33 = uVar33 ^ uVar22;
      uVar37 = uVar35 & uVar33;
      uVar50 = (uVar28 ^ uVar27) & uVar26 ^ uVar31 ^ uVar20 ^ uVar43;
      uVar43 = uVar40 & uVar22 ^ uVar34 ^ uVar40 ^ uVar21 ^ uVar37 ^ uVar43;
      uVar38 = uVar25 & uVar30 ^ uVar34 ^ uVar37 ^ uVar23 ^ uVar38;
      uVar20 = uVar50 ^ uVar46;
      uVar50 = uVar50 & uVar43;
      uVar39 = (uVar50 ^ uVar38) & uVar20 ^ uVar46;
      uVar21 = (uVar46 ^ uVar50) & (uVar43 ^ uVar38);
      uVar37 = uVar21 ^ uVar38;
      uVar21 = (uVar21 ^ uVar50) & uVar38;
      uVar43 = uVar43 ^ uVar21;
      uVar20 = (uVar21 ^ uVar50 ^ uVar38) & uVar39 ^ uVar20;
      uVar50 = uVar43 ^ uVar37;
      uVar38 = uVar20 ^ uVar50;
      uVar44 = uVar50 & (uVar28 ^ uVar27);
      uVar21 = uVar39 ^ uVar37;
      uVar27 = uVar35 & (uVar20 ^ uVar39);
      uVar33 = (uVar20 ^ uVar39) & uVar33;
      uVar30 = uVar30 & uVar39;
      uVar51 = (uVar38 ^ uVar21) & (uVar32 ^ uVar23);
      uVar19 = uVar19 & uVar38;
      uVar46 = uVar20 & uVar40 ^ uVar19 ^ uVar21 & uVar31 ^ uVar33 ^ uVar51;
      uVar34 = uVar46 ^ uVar36 & uVar43;
      uVar46 = uVar46 ^ uVar27;
      uVar31 = uVar46 ^ uVar22 & uVar20;
      uVar28 = uVar34 ^ uVar41 & uVar37;
      uVar41 = uVar41 & uVar37 ^ uVar37 & uVar24;
      uVar25 = uVar39 & uVar25 ^ uVar41 ^ uVar26 & uVar50 ^ uVar44 ^ uVar31;
      uVar31 = uVar19 ^ (uVar36 ^ uVar35) & (uVar38 ^ uVar21) ^ uVar31;
      uVar24 = uVar37 & uVar24 ^ uVar43 & uVar42 ^ uVar38 & uVar32;
      uVar21 = uVar23 & uVar21 ^ uVar24;
      uVar37 = uVar20 & uVar40 ^ uVar25;
      uVar25 = uVar33 ^ uVar51 ^ uVar24 ^ uVar25;
      uVar34 = uVar26 & uVar50 ^ uVar30 ^ uVar22 & uVar20 ^ uVar34;
      uVar46 = uVar46 ^ uVar30;
      uVar30 = uVar41 ^ uVar30 ^ uVar36 & uVar43 ^ uVar44 ^ uVar38 & uVar32 ^ uVar27 ^ uVar51 ^
               uVar31;
      uVar21 = ((uVar21 >> 8 ^ uVar21) & 0xcc00cc00cc00cc) * 0x101 ^ uVar21;
      uVar27 = uVar21 & 0x5555555555555555 | (uVar21 & 0xaaa0aaa0aaa0aaa) << 4 |
               uVar21 >> 0xc & 0xa000a000a000a;
      uVar31 = ((uVar31 >> 8 ^ uVar31) & 0xcc00cc00cc00cc) * 0x101 ^ uVar31;
      uVar23 = uVar31 & 0x5555555555555555 | (uVar31 & 0xaaa0aaa0aaa0aaa) << 4 |
               uVar31 >> 0xc & 0xa000a000a000a;
      uVar34 = ((uVar34 >> 8 ^ uVar34) & 0xcc00cc00cc00cc) * 0x101 ^ uVar34;
      uVar32 = uVar34 & 0x5555555555555555 | (uVar34 & 0xaaa0aaa0aaa0aaa) << 4 |
               uVar34 >> 0xc & 0xa000a000a000a;
      uVar30 = ((uVar30 >> 8 ^ uVar30) & 0xcc00cc00cc00cc) * 0x101 ^ uVar30;
      uVar30 = uVar30 & 0x5555555555555555 | (uVar30 & 0xaaa0aaa0aaa0aaa) << 4 |
               uVar30 >> 0xc & 0xa000a000a000a;
      uVar28 = ((uVar28 >> 8 ^ uVar28) & 0xcc00cc00cc00cc) * 0x101 ^ uVar28;
      local_138 = uVar28 & 0x5555555555555555 | (uVar28 & 0xaaa0aaa0aaa0aaa) << 4 |
                  uVar28 >> 0xc & 0xa000a000a000a;
      uVar37 = ((uVar37 >> 8 ^ uVar37) & 0xcc00cc00cc00cc) * 0x101 ^ uVar37;
      uVar21 = uVar37 & 0x5555555555555555 | (uVar37 & 0xaaa0aaa0aaa0aaa) << 4 |
               uVar37 >> 0xc & 0xa000a000a000a;
      uVar25 = ((uVar25 >> 8 ^ uVar25) & 0xcc00cc00cc00cc) * 0x101 ^ uVar25;
      uVar28 = uVar25 & 0x5555555555555555 | (uVar25 & 0xaaa0aaa0aaa0aaa) << 4 |
               uVar25 >> 0xc & 0xa000a000a000a;
      uVar46 = ((uVar46 >> 8 ^ uVar46) & 0xcc00cc00cc00cc) * 0x101 ^ uVar46;
      uVar33 = uVar46 & 0x5555555555555555 | (uVar46 & 0xaaa0aaa0aaa0aaa) << 4 |
               uVar46 >> 0xc & 0xa000a000a000a;
      psVar29 = local_60 + (uVar45 - 8);
      uVar13 = uVar14 - 1;
      if (uVar14 - 1 == 0) {
        psVar16 = local_60 + uVar45;
      }
      else {
        do {
          uVar14 = uVar13;
          psVar16 = psVar29;
          uVar27 = uVar27 ^ (ulong)psVar16->vt;
          uVar32 = uVar32 ^ (ulong)psVar16[2].vt;
          local_38 = uVar21 ^ (ulong)psVar16[5].vt;
          uVar28 = uVar28 ^ (ulong)psVar16[6].vt;
          uVar33 = uVar33 ^ (ulong)psVar16[7].vt;
          uVar34 = uVar33 ^ uVar32;
          uVar20 = uVar33 ^ uVar27;
          uVar24 = uVar28 ^ local_38;
          uVar45 = uVar20 ^ uVar24;
          uVar45 = (uVar45 >> 1 & 0x7777777777777777 | uVar45 * 8 & 0x8888888888888888) ^ uVar45;
          uVar51 = (local_38 >> 1 & 0x7777777777777777 | local_38 * 8 & 0x8888888888888888) ^
                   local_38;
          local_138 = local_138 ^ (ulong)psVar16[4].vt;
          uVar41 = (local_138 >> 2 & 0x3333333333333333 | local_138 * 4 & 0xcccccccccccccccc) ^
                   local_138;
          uVar23 = uVar23 ^ (ulong)psVar16[1].vt;
          uVar30 = uVar30 ^ (ulong)psVar16[3].vt;
          uVar21 = (uVar34 >> 1 & 0x7777777777777777 | uVar34 * 8 & 0x8888888888888888) ^ uVar34;
          uVar19 = uVar33 ^ uVar28;
          uVar50 = (uVar28 >> 1 & 0x7777777777777777 | uVar28 * 8 & 0x8888888888888888) ^ uVar28;
          uVar47 = uVar34 ^ uVar28;
          uVar35 = (uVar28 >> 2 & 0x3333333333333333 | uVar28 * 4 & 0xcccccccccccccccc) ^ uVar28;
          uVar31 = uVar28 ^ uVar23;
          uVar37 = uVar20 ^ uVar34 ^ local_38 ^ uVar30 ^ uVar31;
          uVar34 = (uVar20 >> 1 & 0x7777777777777777 | uVar20 * 8 & 0x8888888888888888) ^ uVar20;
          uVar26 = (uVar20 >> 2 & 0x3333333333333333 | uVar20 * 4 & 0xcccccccccccccccc) ^ uVar20;
          uVar36 = uVar20 ^ uVar23 ^ uVar19;
          uVar22 = uVar36 ^ uVar24;
          uVar36 = uVar36 ^ uVar32;
          uVar36 = (uVar36 >> 1 & 0x7777777777777777 | uVar36 * 8 & 0x8888888888888888) ^ uVar36;
          uVar22 = (uVar22 >> 1 & 0x7777777777777777 | uVar22 * 8 & 0x8888888888888888) ^ uVar22;
          uVar46 = (local_38 >> 2 & 0x3333333333333333 | local_38 * 4 & 0xcccccccccccccccc) ^
                   local_38;
          uVar48 = (uVar33 >> 1 & 0x7777777777777777 | uVar33 * 8 & 0x8888888888888888) ^ uVar33;
          uVar20 = uVar33 ^ uVar30;
          uVar25 = uVar24 ^ local_138 ^ uVar20;
          uVar25 = (uVar25 >> 1 & 0x7777777777777777 | uVar25 * 8 & 0x8888888888888888) ^ uVar25;
          uVar39 = (uVar23 >> 1 & 0x7777777777777777 | uVar23 * 8 & 0x8888888888888888) ^ uVar23;
          uVar37 = (uVar37 >> 1 & 0x7777777777777777 | uVar37 * 8 & 0x8888888888888888) ^ uVar37;
          uVar24 = (local_138 >> 1 & 0x7777777777777777 | local_138 * 8 & 0x8888888888888888) ^
                   local_138;
          uVar43 = (uVar19 >> 2 & 0x3333333333333333 | uVar19 * 4 & 0xcccccccccccccccc) ^ uVar19;
          uVar44 = (uVar20 >> 2 & 0x3333333333333333 | uVar20 * 4 & 0xcccccccccccccccc) ^ uVar20;
          uVar42 = (uVar20 >> 1 & 0x7777777777777777 | uVar20 * 8 & 0x8888888888888888) ^ uVar20;
          uVar19 = local_38 ^ local_138 ^ uVar19;
          uVar38 = uVar20 ^ local_38 ^ local_138 ^ uVar47;
          uVar47 = (uVar47 >> 2 & 0x3333333333333333 | uVar47 * 4 & 0xcccccccccccccccc) ^ uVar47;
          uVar19 = (uVar19 >> 1 & 0x7777777777777777 | uVar19 * 8 & 0x8888888888888888) ^ uVar19;
          uVar40 = (uVar38 >> 1 & 0x7777777777777777 | uVar38 * 8 & 0x8888888888888888) ^ uVar38;
          uVar20 = (uVar31 >> 2 & 0x3333333333333333 | uVar31 * 4 & 0xcccccccccccccccc) ^ uVar31;
          uVar38 = uVar38 ^ uVar31;
          uVar45 = (uVar35 >> 1 & 0x7777777777777777 | uVar35 * 8 & 0x8888888888888888) ^
                   (uVar48 >> 2 & 0x3333333333333333 | uVar48 * 4 & 0xcccccccccccccccc) ^ uVar27 ^
                   (uVar45 >> 2 & 0x3333333333333333 | uVar45 * 4 & 0xcccccccccccccccc) ^ uVar45;
          uVar23 = (uVar43 >> 1 & 0x7777777777777777 | uVar43 * 8 & 0x8888888888888888) ^
                   (uVar34 >> 2 & 0x3333333333333333 | uVar34 * 4 & 0xcccccccccccccccc) ^ uVar23 ^
                   uVar22 ^ (uVar22 >> 2 & 0x3333333333333333 | uVar22 * 4 & 0xcccccccccccccccc);
          uVar38 = (uVar38 >> 1 & 0x7777777777777777 | uVar38 * 8 & 0x8888888888888888) ^ uVar38;
          uVar37 = (uVar20 >> 1 & 0x7777777777777777 | uVar20 * 8 & 0x8888888888888888) ^
                   (uVar21 >> 2 & 0x3333333333333333 | uVar21 * 4 & 0xcccccccccccccccc) ^ uVar30 ^
                   (uVar37 >> 2 & 0x3333333333333333 | uVar37 * 4 & 0xcccccccccccccccc) ^ uVar37;
          uVar40 = (uVar44 >> 1 & 0x7777777777777777 | uVar44 * 8 & 0x8888888888888888) ^
                   (uVar24 >> 2 & 0x3333333333333333 | uVar24 * 4 & 0xcccccccccccccccc) ^ local_38 ^
                   (uVar40 >> 2 & 0x3333333333333333 | uVar40 * 4 & 0xcccccccccccccccc) ^ uVar40;
          uVar30 = (uVar41 >> 1 & 0x7777777777777777 | uVar41 * 8 & 0x8888888888888888) ^
                   (uVar51 >> 2 & 0x3333333333333333 | uVar51 * 4 & 0xcccccccccccccccc) ^ uVar28 ^
                   uVar25 ^ (uVar25 >> 2 & 0x3333333333333333 | uVar25 * 4 & 0xcccccccccccccccc);
          uVar38 = (uVar47 >> 1 & 0x7777777777777777 | uVar47 * 8 & 0x8888888888888888) ^
                   (uVar42 >> 2 & 0x3333333333333333 | uVar42 * 4 & 0xcccccccccccccccc) ^ local_138
                   ^ (uVar38 >> 2 & 0x3333333333333333 | uVar38 * 4 & 0xcccccccccccccccc) ^ uVar38;
          uVar19 = (uVar46 >> 1 & 0x7777777777777777 | uVar46 * 8 & 0x8888888888888888) ^
                   (uVar50 >> 2 & 0x3333333333333333 | uVar50 * 4 & 0xcccccccccccccccc) ^ uVar33 ^
                   (uVar19 >> 2 & 0x3333333333333333 | uVar19 * 4 & 0xcccccccccccccccc) ^ uVar19;
          uVar24 = uVar38 ^ uVar30;
          uVar20 = uVar24 ^ uVar45 ^ uVar23;
          uVar33 = uVar38 ^ uVar37;
          uVar42 = uVar20 ^ uVar33;
          uVar28 = (uVar26 >> 1 & 0x7777777777777777 | uVar26 * 8 & 0x8888888888888888) ^
                   (uVar39 >> 2 & 0x3333333333333333 | uVar39 * 4 & 0xcccccccccccccccc) ^ uVar32 ^
                   uVar36 ^ (uVar36 >> 2 & 0x3333333333333333 | uVar36 * 4 & 0xcccccccccccccccc) ^
                   uVar42 ^ uVar19;
          uVar50 = uVar42 ^ uVar19 ^ uVar37;
          uVar27 = uVar24 ^ uVar19;
          uVar30 = uVar19 ^ uVar30;
          uVar32 = uVar45 ^ uVar33;
          uVar35 = uVar20 ^ uVar40;
          uVar26 = uVar35 ^ uVar32;
          local_80 = uVar28 ^ uVar33 ^ uVar35;
          uVar39 = local_80 ^ uVar27;
          uVar25 = uVar37 ^ uVar45 ^ uVar30;
          uVar22 = (uVar28 ^ uVar33) & uVar33;
          uVar34 = (uVar39 ^ uVar26) & (uVar33 ^ uVar30) ^ uVar22;
          uVar22 = uVar25 & uVar30 ^ uVar22;
          uVar21 = uVar39 & uVar50;
          uVar31 = local_80 & uVar20 ^ uVar37 ^ uVar45 ^ uVar22 ^ uVar21;
          uVar23 = uVar23 ^ uVar32;
          uVar37 = uVar26 & uVar23;
          uVar43 = uVar27 & (uVar38 ^ uVar19) ^ uVar28 ^ uVar21 ^ uVar34;
          uVar34 = uVar32 & uVar24 ^ uVar40 ^ uVar24 ^ uVar45 ^ uVar37 ^ uVar34;
          uVar22 = uVar42 & uVar35 ^ uVar40 ^ uVar37 ^ uVar33 ^ uVar22;
          uVar37 = uVar43 & uVar34;
          uVar43 = uVar43 ^ uVar31;
          uVar21 = (uVar37 ^ uVar22) & uVar43 ^ uVar31;
          uVar45 = (uVar31 ^ uVar37) & (uVar34 ^ uVar22);
          uVar46 = uVar45 ^ uVar22;
          uVar45 = (uVar45 ^ uVar37) & uVar22;
          uVar34 = uVar34 ^ uVar45;
          uVar43 = (uVar45 ^ uVar37 ^ uVar22) & uVar21 ^ uVar43;
          uVar22 = uVar34 ^ uVar46;
          uVar44 = uVar43 ^ uVar22;
          uVar38 = uVar22 & (uVar38 ^ uVar19);
          uVar51 = uVar21 ^ uVar46;
          uVar41 = uVar26 & (uVar43 ^ uVar21);
          uVar23 = (uVar43 ^ uVar21) & uVar23;
          uVar35 = uVar35 & uVar21;
          uVar36 = (uVar44 ^ uVar51) & (uVar33 ^ uVar30);
          uVar25 = uVar25 & uVar44;
          uVar37 = uVar43 & uVar24 ^ uVar25 ^ uVar51 & uVar28 ^ uVar23 ^ uVar36;
          uVar19 = uVar37 ^ uVar39 & uVar34;
          uVar37 = uVar37 ^ uVar41;
          uVar28 = uVar37 ^ uVar32 & uVar43;
          uVar31 = uVar19 ^ local_80 & uVar46;
          uVar40 = local_80 & uVar46 ^ uVar46 & uVar20;
          uVar45 = uVar25 ^ (uVar39 ^ uVar26) & (uVar44 ^ uVar51) ^ uVar28;
          uVar28 = uVar21 & uVar42 ^ uVar40 ^ uVar27 & uVar22 ^ uVar38 ^ uVar28;
          uVar20 = uVar46 & uVar20 ^ uVar34 & uVar50 ^ uVar44 & uVar30;
          uVar33 = uVar33 & uVar51 ^ uVar20;
          uVar19 = uVar27 & uVar22 ^ uVar35 ^ uVar32 & uVar43 ^ uVar19;
          uVar37 = uVar37 ^ uVar35;
          uVar21 = uVar43 & uVar24 ^ uVar28;
          uVar28 = uVar23 ^ uVar36 ^ uVar20 ^ uVar28;
          uVar30 = uVar40 ^ uVar35 ^ uVar39 & uVar34 ^ uVar38 ^ uVar44 & uVar30 ^ uVar41 ^ uVar36 ^
                   uVar45;
          uVar45 = ((uVar45 >> 8 ^ uVar45) & 0xcc00cc00cc00cc) * 0x101 ^ uVar45;
          uVar33 = ((uVar33 >> 8 ^ uVar33) & 0xcc00cc00cc00cc) * 0x101 ^ uVar33;
          uVar19 = ((uVar19 >> 8 ^ uVar19) & 0xcc00cc00cc00cc) * 0x101 ^ uVar19;
          uVar23 = uVar45 & 0x5555555555555555 | (uVar45 & 0xaaa0aaa0aaa0aaa) << 4 |
                   uVar45 >> 0xc & 0xa000a000a000a;
          uVar31 = ((uVar31 >> 8 ^ uVar31) & 0xcc00cc00cc00cc) * 0x101 ^ uVar31;
          uVar27 = uVar33 & 0x5555555555555555 | (uVar33 & 0xaaa0aaa0aaa0aaa) << 4 |
                   uVar33 >> 0xc & 0xa000a000a000a;
          local_138 = uVar31 & 0x5555555555555555 | (uVar31 & 0xaaa0aaa0aaa0aaa) << 4 |
                      uVar31 >> 0xc & 0xa000a000a000a;
          uVar30 = ((uVar30 >> 8 ^ uVar30) & 0xcc00cc00cc00cc) * 0x101 ^ uVar30;
          uVar21 = ((uVar21 >> 8 ^ uVar21) & 0xcc00cc00cc00cc) * 0x101 ^ uVar21;
          uVar32 = uVar19 & 0x5555555555555555 | (uVar19 & 0xaaa0aaa0aaa0aaa) << 4 |
                   uVar19 >> 0xc & 0xa000a000a000a;
          uVar28 = ((uVar28 >> 8 ^ uVar28) & 0xcc00cc00cc00cc) * 0x101 ^ uVar28;
          uVar21 = uVar21 & 0x5555555555555555 | (uVar21 & 0xaaa0aaa0aaa0aaa) << 4 |
                   uVar21 >> 0xc & 0xa000a000a000a;
          uVar28 = uVar28 & 0x5555555555555555 | (uVar28 & 0xaaa0aaa0aaa0aaa) << 4 |
                   uVar28 >> 0xc & 0xa000a000a000a;
          uVar30 = uVar30 & 0x5555555555555555 | (uVar30 & 0xaaa0aaa0aaa0aaa) << 4 |
                   uVar30 >> 0xc & 0xa000a000a000a;
          uVar37 = ((uVar37 >> 8 ^ uVar37) & 0xcc00cc00cc00cc) * 0x101 ^ uVar37;
          uVar33 = uVar37 & 0x5555555555555555 | (uVar37 & 0xaaa0aaa0aaa0aaa) << 4 |
                   uVar37 >> 0xc & 0xa000a000a000a;
          psVar29 = psVar16 + -8;
          uVar13 = uVar14 - 1;
        } while (uVar14 - 1 != 0);
      }
      local_78 = (ulong)uVar14;
      psVar1 = psVar29->vt;
      psVar2 = psVar16[-7].vt;
      psVar3 = psVar16[-6].vt;
      psVar4 = psVar16[-5].vt;
      psVar5 = psVar16[-4].vt;
      psVar6 = psVar16[-3].vt;
      psVar7 = psVar16[-2].vt;
      psVar8 = psVar16[-1].vt;
      lVar18 = 0;
      do {
        bVar17 = (byte)lVar18;
        uVar34 = (uVar23 ^ (ulong)psVar2) >> (bVar17 & 0x3f) & 0xffff |
                 (ulong)(uint)((int)((uVar30 ^ (ulong)psVar4) >> (bVar17 & 0x3f)) << 0x10) |
                 ((uVar21 ^ (ulong)psVar6) >> (bVar17 & 0x3f) & 0xffff) << 0x20 |
                 ((uVar33 ^ (ulong)psVar8) >> (bVar17 & 0x3f)) << 0x30;
        uVar37 = (uVar27 ^ (ulong)psVar1) >> (bVar17 & 0x3f) & 0xffff |
                 (ulong)(uint)((int)((uVar32 ^ (ulong)psVar3) >> (bVar17 & 0x3f)) << 0x10) |
                 ((local_138 ^ (ulong)psVar5) >> (bVar17 & 0x3f) & 0xffff) << 0x20 |
                 ((uVar28 ^ (ulong)psVar7) >> (bVar17 & 0x3f)) << 0x30;
        uVar45 = (uVar37 >> 8 ^ uVar34) & 0xff00ff00ff00ff;
        uVar37 = uVar45 << 8 ^ uVar37;
        uVar45 = uVar45 ^ uVar34;
        uVar34 = (ulong)(((uint)(uVar37 >> 0x1c) ^ (uint)uVar37) & 0xf0f0f0f0);
        uVar37 = (uVar34 << 0x1c | uVar34) ^ uVar37;
        uVar34 = (ulong)(((uint)(uVar45 >> 0x1c) ^ (uint)uVar45) & 0xf0f0f0f0);
        uVar45 = (uVar34 << 0x1c | uVar34) ^ uVar45;
        uVar37 = ((uVar37 >> 0xe ^ uVar37) & 0xcccc0000cccc) * 0x4001 ^ uVar37;
        uVar45 = ((uVar45 >> 0xe ^ uVar45) & 0xcccc0000cccc) * 0x4001 ^ uVar45;
        uVar37 = ((uVar37 >> 7 ^ uVar37) & 0xaa00aa00aa00aa) * 0x81 ^ uVar37;
        uVar45 = ((uVar45 >> 7 ^ uVar45) & 0xaa00aa00aa00aa) * 0x81 ^ uVar45;
        *(char *)((long)&local_c8 + lVar18) = (char)uVar37;
        *(char *)((long)&local_c8 + lVar18 + 1) = (char)(uVar37 >> 8);
        *(char *)((long)&local_c8 + lVar18 + 2) = (char)(uVar37 >> 0x10);
        *(char *)((long)&local_c8 + lVar18 + 3) = (char)(uVar37 >> 0x18);
        *(char *)((long)&local_c8 + lVar18 + 4) = (char)(uVar37 >> 0x20);
        *(char *)((long)&local_c8 + lVar18 + 5) = (char)(uVar37 >> 0x28);
        *(char *)((long)&local_c8 + lVar18 + 6) = (char)(uVar37 >> 0x30);
        *(char *)((long)&local_c8 + lVar18 + 7) = (char)(uVar37 >> 0x38);
        *(char *)((long)&uStack_c0 + lVar18) = (char)uVar45;
        *(char *)((long)&uStack_c0 + lVar18 + 1) = (char)(uVar45 >> 8);
        *(char *)((long)&uStack_c0 + lVar18 + 2) = (char)(uVar45 >> 0x10);
        *(char *)((long)&uStack_c0 + lVar18 + 3) = (char)(uVar45 >> 0x18);
        *(char *)((long)&uStack_c0 + lVar18 + 4) = (char)(uVar45 >> 0x20);
        *(char *)((long)&uStack_c0 + lVar18 + 5) = (char)(uVar45 >> 0x28);
        *(char *)((long)&uStack_c0 + lVar18 + 6) = (char)(uVar45 >> 0x30);
        *(char *)((long)&uStack_c0 + lVar18 + 7) = (char)(uVar45 >> 0x38);
        lVar18 = lVar18 + 0x10;
      } while (lVar18 != 0x40);
      lVar18 = local_50 + (local_50 == 0);
      lVar49 = 0;
      do {
        vout = (undefined8 *)((long)&local_c8 + lVar49);
        memxor16(vout,vout,local_68);
        psVar1 = (ssh_cipheralg *)((undefined8 *)((long)pvVar12 + lVar49))[1];
        local_68->vt = *(ssh_cipheralg **)((long)pvVar12 + lVar49);
        local_68[1].vt = psVar1;
        uVar11 = *(undefined8 *)((long)&uStack_c0 + lVar49);
        *(undefined8 *)((long)pvVar12 + lVar49) = *vout;
        ((undefined8 *)((long)pvVar12 + lVar49))[1] = uVar11;
        lVar49 = lVar49 + 0x10;
      } while (lVar18 * 0x10 != lVar49);
      vblk = (void *)((long)pvVar12 + local_58);
      uVar15 = local_48 - uVar15;
    } while (uVar15 != 0);
  }
  smemclr(&local_c8,0x40);
  return;
}

Assistant:

static inline void aes_cbc_sw_decrypt(
    ssh_cipher *ciph, void *vblk, int blklen)
{
    aes_sw_context *ctx = container_of(ciph, aes_sw_context, ciph);
    uint8_t *blk = (uint8_t *)vblk;

    /*
     * CBC decryption can run in parallel, because all the
     * _ciphertext_ blocks are already available.
     */

    size_t blocks_remaining = blklen / 16;

    uint8_t data[SLICE_PARALLELISM * 16];
    /* Zeroing the data array is probably overcautious, but it avoids
     * technically undefined behaviour from leaving it uninitialised
     * if our very first iteration doesn't include enough cipher
     * blocks to populate it fully */
    memset(data, 0, sizeof(data));

    while (blocks_remaining > 0) {
        /* Number of blocks we'll handle in this iteration. If we're
         * dealing with fewer than the maximum, it doesn't matter -
         * it's harmless to run the full parallel cipher function
         * anyway. */
        size_t blocks = (blocks_remaining < SLICE_PARALLELISM ?
                         blocks_remaining : SLICE_PARALLELISM);

        /* Parallel-decrypt the input, in a separate array so we still
         * have the cipher stream available for XORing. */
        memcpy(data, blk, 16 * blocks);
        aes_sliced_d_parallel(data, data, &ctx->sk);

        /* Write the output and update the IV */
        for (size_t i = 0; i < blocks; i++) {
            uint8_t *decrypted = data + 16*i;
            uint8_t *output = blk + 16*i;

            memxor16(decrypted, decrypted, ctx->iv.cbc.prevblk);
            memcpy(ctx->iv.cbc.prevblk, output, 16);
            memcpy(output, decrypted, 16);
        }

        /* Advance the input pointer. */
        blk += 16 * blocks;
        blocks_remaining -= blocks;
    }

    smemclr(data, sizeof(data));
}